

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall
mkvmuxer::Segment::DoNewClusterProcessing
          (Segment *this,uint64_t track_number,uint64_t frame_timestamp_ns,bool is_key)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  long in_RDI;
  undefined1 unaff_retaddr;
  uint64_t in_stack_00000008;
  int frame_count;
  int result;
  uint64_t in_stack_00000080;
  Segment *in_stack_00000088;
  
  do {
    iVar2 = TestFrame((Segment *)frame_timestamp_ns,CONCAT17(is_key,_result),in_stack_00000008,
                      (bool)unaff_retaddr);
    if (iVar2 < 0) {
      return false;
    }
    *(undefined1 *)(in_RDI + 0x128) = 0;
    if ((0 < iVar2) && (bVar1 = MakeNewCluster(in_stack_00000088,in_stack_00000080), !bVar1)) {
      return false;
    }
    iVar3 = WriteFramesAll((Segment *)frame_timestamp_ns);
    if (iVar3 < 0) {
      return false;
    }
  } while (1 < iVar2);
  return true;
}

Assistant:

bool Segment::DoNewClusterProcessing(uint64_t track_number,
                                     uint64_t frame_timestamp_ns, bool is_key) {
  for (;;) {
    // Based on the characteristics of the current frame and current
    // cluster, decide whether to create a new cluster.
    const int result = TestFrame(track_number, frame_timestamp_ns, is_key);
    if (result < 0)  // error
      return false;

    // Always set force_new_cluster_ to false after TestFrame.
    force_new_cluster_ = false;

    // A non-zero result means create a new cluster.
    if (result > 0 && !MakeNewCluster(frame_timestamp_ns))
      return false;

    // Write queued (audio) frames.
    const int frame_count = WriteFramesAll();
    if (frame_count < 0)  // error
      return false;

    // Write the current frame to the current cluster (if TestFrame
    // returns 0) or to a newly created cluster (TestFrame returns 1).
    if (result <= 1)
      return true;

    // TestFrame returned 2, which means there was a large time
    // difference between the cluster and the frame itself.  Do the
    // test again, comparing the frame to the new cluster.
  }
}